

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool __thiscall duckdb_snappy::SnappyDecompressor::RefillTag(SnappyDecompressor *this)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  size_t __n;
  byte *pbVar6;
  ulong uVar7;
  size_t n;
  ulong local_38;
  byte *__src;
  
  __src = (byte *)this->ip_;
  pbVar6 = (byte *)this->ip_limit_;
  local_38 = in_RAX;
  if (__src == pbVar6) {
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    iVar2 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
    __src = (byte *)CONCAT44(extraout_var,iVar2);
    this->peeked_ = (uint32_t)local_38;
    this->eof_ = local_38 == 0;
    if (local_38 == 0) {
      return false;
    }
    pbVar6 = __src + local_38;
    this->ip_limit_ = (char *)pbVar6;
  }
  bVar1 = *__src;
  if ((bVar1 & 3) == 0 && 0xef < bVar1) {
    uVar4 = (bVar1 >> 2) - 0x3a;
  }
  else {
    uVar4 = 0x5030201U >> ((bVar1 & 3) << 3) & 0xff;
  }
  uVar7 = (long)pbVar6 - (long)__src;
  uVar5 = (uint)uVar7;
  if (uVar5 < uVar4) {
    pcVar3 = this->scratch_;
    memmove(pcVar3,__src,uVar7 & 0xffffffff);
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    do {
      iVar2 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
      if (local_38 == 0) {
        return false;
      }
      uVar5 = uVar4 - (int)uVar7;
      __n = (size_t)uVar5;
      if ((uint)local_38 <= uVar5) {
        __n = local_38 & 0xffffffff;
      }
      switchD_00b041bd::default
                (pcVar3 + (uVar7 & 0xffffffff),(void *)CONCAT44(extraout_var_00,iVar2),__n);
      uVar5 = (int)uVar7 + (int)__n;
      uVar7 = (ulong)uVar5;
      (*this->reader_->_vptr_Source[4])(this->reader_,__n);
    } while (uVar5 < uVar4);
    this->ip_ = pcVar3;
    pcVar3 = pcVar3 + uVar4;
  }
  else {
    if (4 < uVar5) {
      this->ip_ = (char *)__src;
      return true;
    }
    memmove(this->scratch_,__src,(ulong)(uVar5 & 7));
    (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
    this->peeked_ = 0;
    this->ip_ = this->scratch_;
    pcVar3 = this->scratch_ + (uVar5 & 7);
  }
  this->ip_limit_ = pcVar3;
  return true;
}

Assistant:

bool SnappyDecompressor::RefillTag() {
  const char* ip = ip_;
  if (ip == ip_limit_) {
    // Fetch a new fragment from the reader
    reader_->Skip(peeked_);  // All peeked bytes are used up
    size_t n;
    ip = reader_->Peek(&n);
    peeked_ = n;
    eof_ = (n == 0);
    if (eof_) return false;
    ip_limit_ = ip + n;
  }

  // Read the tag character
  assert(ip < ip_limit_);
  const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
  // At this point make sure that the data for the next tag is consecutive.
  // For copy 1 this means the next 2 bytes (tag and 1 byte offset)
  // For copy 2 the next 3 bytes (tag and 2 byte offset)
  // For copy 4 the next 5 bytes (tag and 4 byte offset)
  // For all small literals we only need 1 byte buf for literals 60...63 the
  // length is encoded in 1...4 extra bytes.
  const uint32_t needed = CalculateNeeded(c);
  assert(needed <= sizeof(scratch_));

  // Read more bytes from reader if needed
  uint32_t nbuf = ip_limit_ - ip;
  if (nbuf < needed) {
    // Stitch together bytes from ip and reader to form the word
    // contents.  We store the needed bytes in "scratch_".  They
    // will be consumed immediately by the caller since we do not
    // read more than we need.
    std::memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    while (nbuf < needed) {
      size_t length;
      const char* src = reader_->Peek(&length);
      if (length == 0) return false;
      uint32_t to_add = std::min<uint32_t>(needed - nbuf, length);
      std::memcpy(scratch_ + nbuf, src, to_add);
      nbuf += to_add;
      reader_->Skip(to_add);
    }
    assert(nbuf == needed);
    ip_ = scratch_;
    ip_limit_ = scratch_ + needed;
  } else if (nbuf < kMaximumTagLength) {
    // Have enough bytes, but move into scratch_ so that we do not
    // read past end of input
    std::memmove(scratch_, ip, nbuf);
    reader_->Skip(peeked_);  // All peeked bytes are used up
    peeked_ = 0;
    ip_ = scratch_;
    ip_limit_ = scratch_ + nbuf;
  } else {
    // Pass pointer to buffer returned by reader_.
    ip_ = ip;
  }
  return true;
}